

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

void __thiscall camp::NullObject::NullObject(NullObject *this,Class *objectClass)

{
  string *psVar1;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (objectClass == (Class *)0x0) {
    std::__cxx11::string::string((string *)&local_50,"unknown",&local_51);
  }
  else {
    psVar1 = Class::name_abi_cxx11_(objectClass);
    std::__cxx11::string::string((string *)&local_50,(string *)psVar1);
  }
  std::operator+(&local_30,"trying to use a null metaobject of class ",&local_50);
  Error::Error(&this->super_Error,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)&this->super_Error = &PTR__Error_00141148;
  return;
}

Assistant:

NullObject::NullObject(const Class* objectClass)
    : Error("trying to use a null metaobject of class " + (objectClass ? objectClass->name() : "unknown"))
{
}